

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_vmmath.c
# Opt level: O0

double lj_vm_foldarith(double x,double y,int op)

{
  double dVar1;
  double local_48;
  double local_40;
  int op_local;
  double y_local;
  double x_local;
  
  x_local = x;
  switch(op) {
  case 0:
    x_local = x + y;
    break;
  case 1:
    x_local = x - y;
    break;
  case 2:
    x_local = x * y;
    break;
  case 3:
    x_local = x / y;
    break;
  case 4:
    dVar1 = lj_vm_floormul(x,y);
    x_local = x - dVar1;
    break;
  case 5:
    x_local = pow(x,y);
    break;
  case 6:
    x_local = -x;
    break;
  case 7:
    x_local = ABS(x);
    break;
  case 8:
    x_local = ldexp(x,(int)y);
    break;
  case 9:
    local_40 = y;
    if (x < y) {
      local_40 = x;
    }
    x_local = local_40;
    break;
  case 10:
    local_48 = y;
    if (y < x) {
      local_48 = x;
    }
    x_local = local_48;
  }
  return x_local;
}

Assistant:

double lj_vm_foldarith(double x, double y, int op)
{
  switch (op) {
  case IR_ADD - IR_ADD: return x+y; break;
  case IR_SUB - IR_ADD: return x-y; break;
  case IR_MUL - IR_ADD: return x*y; break;
  case IR_DIV - IR_ADD: return x/y; break;
  case IR_MOD - IR_ADD: return x-lj_vm_floormul(x, y); break;
  case IR_POW - IR_ADD: return pow(x, y); break;
  case IR_NEG - IR_ADD: return -x; break;
  case IR_ABS - IR_ADD: return fabs(x); break;
#if LJ_HASJIT
  case IR_LDEXP - IR_ADD: return ldexp(x, (int)y); break;
  case IR_MIN - IR_ADD: return x < y ? x : y; break;
  case IR_MAX - IR_ADD: return x > y ? x : y; break;
#endif
  default: return x;
  }
}